

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::
SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>
::
Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::prepareChildren(Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
                  *this,Node *n,bool backtrackable)

{
  ulong uVar1;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Node_**>
  *this_00;
  byte in_DL;
  __uniq_ptr_impl<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
  in_RSI;
  long in_RDI;
  IntermediateNode *inode;
  undefined4 in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  Stack<unsigned_int> *in_stack_ffffffffffffff70;
  BacktrackData *this_01;
  anon_class_8_1_8991fb9c_for__fun_conflict10 function;
  UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
  *in_stack_ffffffffffffff88;
  BacktrackData local_60;
  _Head_base<0UL,_Kernel::RobSubstitution_*,_false> local_58;
  undefined8 uStack_50;
  _Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false> local_48;
  byte local_11;
  __uniq_ptr_impl<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
  local_10;
  
  local_11 = in_DL & 1;
  local_10._M_t.
  super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
  .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>._M_head_impl =
       in_RSI._M_t.
       super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
       .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>._M_head_impl;
  uVar1 = (**(code **)(*(long *)in_RSI._M_t.
                                super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
                                .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>.
                                _M_head_impl + 0x10))();
  if ((uVar1 & 1) == 0) {
    local_48._M_head_impl =
         (UnificationConstraintStack *)
         local_10._M_t.
         super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
         .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>._M_head_impl;
    Lib::Stack<unsigned_int>::push(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    local_58._M_head_impl = (RobSubstitution *)0x0;
    uStack_50 = 0;
    function.this =
         (Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
          *)&stack0xffffffffffffffa8;
    Lib::
    Option<Lib::VirtualIterator<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs_*>_>
    ::Option((Option<Lib::VirtualIterator<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs_*>_>
              *)0x51c521);
    Lib::
    Option<Lib::VirtualIterator<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs_*>_>
    ::operator=((Option<Lib::VirtualIterator<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs_*>_>
                 *)in_stack_ffffffffffffff70,
                (Option<Lib::VirtualIterator<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs_*>_>
                 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    Lib::
    Option<Lib::VirtualIterator<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs_*>_>
    ::~Option((Option<Lib::VirtualIterator<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs_*>_>
               *)0x51c540);
    this_00 = (VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Node_**>
               *)(in_RDI + 0x70);
    this_01 = &local_60;
    RetrievalAlgorithms::
    UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>
    ::
    selectPotentiallyUnifiableChildren<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>>::Rhs>
              (in_stack_ffffffffffffff88,(IntermediateNode *)function.this);
    Lib::
    Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Node_**>_>
    ::push((Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Node_**>_>
            *)function.this,
           (VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Node_**>
            *)this_01);
    Lib::
    VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs>::Node_**>
    ::~VirtualIterator(this_00);
    if ((local_11 & 1) != 0) {
      Lib::Stack<Lib::BacktrackData>::top((Stack<Lib::BacktrackData> *)(in_RDI + 0x98));
      Lib::BacktrackData::
      addClosure<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>>::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>::prepareChildren(Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>>::Rhs>::Node*,bool)::_lambda()_1_>
                (this_01,function);
    }
  }
  else {
    (**(code **)(*(long *)local_10._M_t.
                          super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
                          .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>.
                          _M_head_impl + 0x40))();
    Lib::
    some<Lib::VirtualIterator<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>>::Rhs*>>
              ((VirtualIterator<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs_*>
                *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    Lib::
    Option<Lib::VirtualIterator<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs_*>_>
    ::operator=((Option<Lib::VirtualIterator<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs_*>_>
                 *)in_stack_ffffffffffffff70,
                (Option<Lib::VirtualIterator<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs_*>_>
                 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    Lib::
    Option<Lib::VirtualIterator<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs_*>_>
    ::~Option((Option<Lib::VirtualIterator<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs_*>_>
               *)0x51c4a1);
    Lib::
    VirtualIterator<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs_*>
    ::~VirtualIterator((VirtualIterator<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RealConstantType>_>::Rhs_*>
                        *)in_stack_ffffffffffffff70);
  }
  return;
}

Assistant:

void prepareChildren(Node* n, bool backtrackable) {
        if(n->isLeaf()) {
          _leafData = some(static_cast<Leaf*>(n)->allChildren());
        } else {
          IntermediateNode* inode=static_cast<IntermediateNode*>(n);
          _svStack.push(inode->childVar);
          _leafData = {};
          DEBUG_QUERY(1, "entering node: S", _svStack.top())
          
          _nodeIterators.push(_algo.template selectPotentiallyUnifiableChildren<LeafData>(inode));
          if (backtrackable) {
            _bdStack.top().addClosure([&]() { 
                DEBUG_CODE(auto var = )_svStack.pop();
                DEBUG_QUERY(1, "backtracking node: S", var)
                _nodeIterators.pop(); 
            });
          }
        }
      }